

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_ns_cert_type(uchar **p,uchar *end,uchar *ns_cert_type)

{
  int iVar1;
  mbedtls_x509_bitstring bs;
  mbedtls_asn1_bitstring local_28;
  
  local_28.len = 0;
  local_28.unused_bits = '\0';
  local_28._9_7_ = 0;
  local_28.p = (uchar *)0x0;
  iVar1 = mbedtls_asn1_get_bitstring(p,end,&local_28);
  if (iVar1 == 0) {
    iVar1 = -0x2564;
    if (local_28.len == 1) {
      *ns_cert_type = *local_28.p;
      iVar1 = 0;
    }
  }
  else {
    iVar1 = iVar1 + -0x2500;
  }
  return iVar1;
}

Assistant:

static int x509_get_ns_cert_type( unsigned char **p,
                                       const unsigned char *end,
                                       unsigned char *ns_cert_type)
{
    int ret;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if( ( ret = mbedtls_asn1_get_bitstring( p, end, &bs ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( bs.len != 1 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    /* Get actual bitstring */
    *ns_cert_type = *bs.p;
    return( 0 );
}